

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
ArrayToVectorState<true,_unsigned_int>::Uint
          (ArrayToVectorState<true,_unsigned_int> *this,Context<true> *param_1,uint f)

{
  uint local_c;
  
  local_c = f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this->output_array,&local_c);
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& /* ctx */, unsigned f)
  {
    output_array->push_back((T)f);
    return this;
  }